

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Xml.h
# Opt level: O0

void __thiscall asl::Xml::Xml(Xml *this,Xml *param_1)

{
  Xml *param_1_local;
  Xml *this_local;
  
  NodeBase::NodeBase(&this->super_NodeBase,&param_1->super_NodeBase);
  return;
}

Assistant:

class ASL_API Xml : public NodeBase
{
protected:

	struct ASL_API _Xml : public _NodeBase
	{
		String tag;
		Map<> attribs;
		Array<Xml> children;
		mutable _Xml* parent;
		_Xml() : parent(NULL) {}
		_Xml(const String& t) : tag(t), parent(NULL) {}
		virtual const String& text() const;
		virtual bool isText() const { return false; }
		virtual _Xml* clone(bool detach = true) const;
	}